

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

rbu_file * rbuFindMaindb(rbu_vfs *pRbuVfs,char *zWal,int bRbu)

{
  rbu_file *prVar1;
  
  if (pRbuVfs->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(pRbuVfs->mutex);
  }
  if (bRbu == 0) {
    for (prVar1 = pRbuVfs->pMain; prVar1 != (rbu_file *)0x0; prVar1 = prVar1->pMainNext) {
      if (prVar1->zWal == zWal) goto LAB_001d382b;
    }
  }
  else {
    for (prVar1 = pRbuVfs->pMainRbu; prVar1 != (rbu_file *)0x0; prVar1 = prVar1->pMainRbuNext) {
      if (prVar1->zWal == zWal) goto LAB_001d382b;
    }
  }
  prVar1 = (rbu_file *)0x0;
LAB_001d382b:
  if (pRbuVfs->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(pRbuVfs->mutex);
  }
  return prVar1;
}

Assistant:

static rbu_file *rbuFindMaindb(rbu_vfs *pRbuVfs, const char *zWal, int bRbu){
  rbu_file *pDb;
  sqlite3_mutex_enter(pRbuVfs->mutex);
  if( bRbu ){
    for(pDb=pRbuVfs->pMainRbu; pDb && pDb->zWal!=zWal; pDb=pDb->pMainRbuNext){}
  }else{
    for(pDb=pRbuVfs->pMain; pDb && pDb->zWal!=zWal; pDb=pDb->pMainNext){}
  }
  sqlite3_mutex_leave(pRbuVfs->mutex);
  return pDb;
}